

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptConversion.cpp
# Opt level: O1

double Js::JavascriptConversion::ToNumber_Full(Var aValue,ScriptContext *scriptContext)

{
  void *pvVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  RecyclableObject *pRVar7;
  JavascriptBoolean *pJVar8;
  JavascriptString *this;
  JavascriptTypedNumber<long> *pJVar9;
  JavascriptTypedNumber<unsigned_long> *pJVar10;
  Type TVar11;
  double dVar12;
  undefined1 auVar13 [16];
  ScriptContext *local_40;
  
  if (((ulong)aValue & 0x1ffff00000000) != 0x1000000000000 &&
      ((ulong)aValue & 0xffff000000000000) == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar3) goto LAB_00a99af7;
    *puVar6 = 0;
  }
  if (((ulong)aValue & 0xffff000000000000) == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptConversion.cpp"
                                ,0x353,"(!TaggedInt::Is(aValue))","Should be detected");
    if (!bVar3) {
LAB_00a99af7:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  bVar3 = VarIs<Js::RecyclableObject>(aValue);
  if (bVar3) {
    pRVar7 = UnsafeVarTo<Js::RecyclableObject>(aValue);
    local_40 = (((((pRVar7->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
               scriptContext.ptr;
  }
  else {
    local_40 = (ScriptContext *)0x0;
  }
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  bVar3 = true;
LAB_00a99716:
  if (aValue == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar4) goto LAB_00a99af7;
    *puVar6 = 0;
  }
  if (((ulong)aValue & 0x1ffff00000000) != 0x1000000000000 &&
      ((ulong)aValue & 0xffff000000000000) == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar4) goto LAB_00a99af7;
    *puVar6 = 0;
  }
  TVar11 = TypeIds_FirstNumberType;
  if ((((ulong)aValue & 0xffff000000000000) != 0x1000000000000) &&
     (TVar11 = TypeIds_Number, aValue < (Var)0x4000000000000)) {
    pRVar7 = UnsafeVarTo<Js::RecyclableObject>(aValue);
    if (pRVar7 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar4) goto LAB_00a99af7;
      *puVar6 = 0;
    }
    TVar11 = ((pRVar7->type).ptr)->typeId;
    if ((0x57 < (int)TVar11) && (BVar5 = RecyclableObject::IsExternal(pRVar7), BVar5 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar4) goto LAB_00a99af7;
      *puVar6 = 0;
    }
  }
  switch(TVar11) {
  case TypeIds_Undefined:
    goto switchD_00a9994d_caseD_0;
  case TypeIds_Null:
    goto switchD_00a9994d_caseD_1;
  case TypeIds_Boolean:
    pJVar8 = UnsafeVarTo<Js::JavascriptBoolean>(aValue);
    if (pJVar8->value != 0) {
      return 1.0;
    }
switchD_00a9994d_caseD_1:
    dVar12 = 0.0;
    break;
  case TypeIds_FirstNumberType:
    dVar12 = (double)(int)aValue;
    break;
  case TypeIds_Number:
    if (aValue < (Var)0x4000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.h"
                                  ,0xd4,"(Is(aValue))",
                                  "Ensure var is actually a \'JavascriptNumber\'");
      if (!bVar3) goto LAB_00a99af7;
      *puVar6 = 0;
    }
    dVar12 = (double)((ulong)aValue ^ 0xfffc000000000000);
    break;
  case TypeIds_Int64Number:
    pJVar9 = UnsafeVarTo<Js::JavascriptTypedNumber<long>>(aValue);
    dVar12 = (double)pJVar9->m_value;
    break;
  case TypeIds_LastNumberType:
    pJVar10 = UnsafeVarTo<Js::JavascriptTypedNumber<unsigned_long>>(aValue);
    auVar13._0_8_ = (double)CONCAT44(0x43300000,(int)pJVar10->m_value);
    auVar13._8_4_ = (int)(pJVar10->m_value >> 0x20);
    auVar13._12_4_ = 0x45300000;
    dVar12 = (auVar13._0_8_ - 4503599627370496.0) + (auVar13._8_8_ - 1.9342813113834067e+25);
    break;
  case TypeIds_String:
    this = UnsafeVarTo<Js::JavascriptString>(aValue);
    dVar12 = JavascriptString::ToDouble(this);
    return dVar12;
  case TypeIds_Symbol:
    JavascriptError::TryThrowTypeError(local_40,scriptContext,-0x7ff5ec77,(PCWSTR)0x0);
switchD_00a9994d_caseD_0:
    pvVar1 = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
             super_JavascriptLibraryBase).nan.ptr;
    if (pvVar1 < (void *)0x4000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.h"
                                  ,0xd4,"(Is(aValue))",
                                  "Ensure var is actually a \'JavascriptNumber\'");
      if (!bVar3) goto LAB_00a99af7;
      *puVar6 = 0;
    }
    dVar12 = (double)((ulong)pvVar1 ^ 0xfffc000000000000);
    break;
  default:
    BVar5 = JavascriptOperators::IsObject(aValue);
    if (BVar5 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptConversion.cpp"
                                  ,0x378,"(JavascriptOperators::IsObject(aValue))",
                                  "bad type object in conversion ToInteger");
      if (bVar4) {
        *puVar6 = 0;
        goto LAB_00a9991b;
      }
      goto LAB_00a99af7;
    }
LAB_00a9991b:
    if (!bVar3) {
      JavascriptError::ThrowError(scriptContext,-0x7ff5fe4a,(PCWSTR)0x0);
    }
    aValue = ToPrimitive<(Js::JavascriptHint)2>(aValue,scriptContext);
    bVar3 = false;
    goto LAB_00a99716;
  }
  return dVar12;
}

Assistant:

double JavascriptConversion::ToNumber_Full(Var aValue,ScriptContext* scriptContext)
    {
        AssertMsg(!TaggedInt::Is(aValue), "Should be detected");
        ScriptContext * objectScriptContext = VarIs<RecyclableObject>(aValue) ? UnsafeVarTo<RecyclableObject>(aValue)->GetScriptContext() : nullptr;
        BOOL fPrimitiveOnly = false;
        while(true)
        {
            switch (JavascriptOperators::GetTypeId(aValue))
            {
            case TypeIds_Symbol:
                JavascriptError::TryThrowTypeError(objectScriptContext, scriptContext, JSERR_NeedNumber);
                // Fallthrough to return NaN if exceptions are disabled

            case TypeIds_Undefined:
                return JavascriptNumber::GetValue(scriptContext->GetLibrary()->GetNaN());

            case TypeIds_Null:
                return  0;

            case TypeIds_Integer:
                return TaggedInt::ToDouble(aValue);

            case TypeIds_Boolean:
                return UnsafeVarTo<JavascriptBoolean>(aValue)->GetValue() ? 1 : +0;

            case TypeIds_Number:
                return JavascriptNumber::GetValue(aValue);

            case TypeIds_Int64Number:
                return (double)UnsafeVarTo<JavascriptInt64Number>(aValue)->GetValue();

            case TypeIds_UInt64Number:
                return (double)UnsafeVarTo<JavascriptUInt64Number>(aValue)->GetValue();

            case TypeIds_String:
                return UnsafeVarTo<JavascriptString>(aValue)->ToDouble();

            default:
                {
                    AssertMsg(JavascriptOperators::IsObject(aValue), "bad type object in conversion ToInteger");
                    if(fPrimitiveOnly)
                    {
                        JavascriptError::ThrowError(scriptContext, VBSERR_OLENoPropOrMethod);
                    }
                    fPrimitiveOnly = true;
                    aValue = ToPrimitive<JavascriptHint::HintNumber>(aValue, scriptContext);
                }
            }
        }
    }